

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_outcome_set_additional_data
              (SASL_OUTCOME_HANDLE sasl_outcome,amqp_binary additional_data_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  amqp_binary value;
  AMQP_VALUE additional_data_amqp_value;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  int result;
  SASL_OUTCOME_HANDLE sasl_outcome_local;
  amqp_binary additional_data_value_local;
  
  if (sasl_outcome == (SASL_OUTCOME_HANDLE)0x0) {
    sasl_outcome_instance._4_4_ = 0x2e6f;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(additional_data_value._0_12_,0);
    value.length = SUB124(additional_data_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      sasl_outcome_instance._4_4_ = 0x2e77;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_outcome->composite_value,1,item_value);
      if (iVar1 == 0) {
        sasl_outcome_instance._4_4_ = 0;
      }
      else {
        sasl_outcome_instance._4_4_ = 0x2e7d;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return sasl_outcome_instance._4_4_;
}

Assistant:

int sasl_outcome_set_additional_data(SASL_OUTCOME_HANDLE sasl_outcome, amqp_binary additional_data_value)
{
    int result;

    if (sasl_outcome == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        AMQP_VALUE additional_data_amqp_value = amqpvalue_create_binary(additional_data_value);
        if (additional_data_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_outcome_instance->composite_value, 1, additional_data_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(additional_data_amqp_value);
        }
    }

    return result;
}